

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  undefined1 (*rankStats) [32];
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  U32 UVar10;
  size_t sVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  size_t sVar25;
  int iVar26;
  undefined1 auVar27 [16];
  uint local_114;
  U32 nbSymbols;
  U32 tableLog;
  undefined8 *local_f0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined8 uStack_7c;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  sVar8 = 0xffffffffffffffd4;
  sVar25 = sVar8;
  if (0x5db < wkspSize) {
    uVar5 = *DTable;
    uVar9 = uVar5 & 0xff;
    rankStats = (undefined1 (*) [32])((long)workSpace + 0x270);
    auVar27 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)workSpace + 700) = ZEXT1632(auVar27);
    *(undefined1 (*) [32])((long)workSpace + 0x2b0) = ZEXT1632(auVar27);
    *(undefined1 (*) [32])((long)workSpace + 0x290) = ZEXT1632(auVar27);
    *rankStats = ZEXT1632(auVar27);
    if (((uVar9 < 0xd) &&
        (local_f0 = (undefined8 *)workSpace,
        sVar11 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,(U32 *)rankStats,&nbSymbols,
                               &tableLog,src,srcSize), sVar25 = sVar11, sVar11 < 0xffffffffffffff89)
        ) && (iVar14 = uVar9 - tableLog, sVar25 = sVar8, tableLog <= uVar9)) {
      uVar19 = 0;
      UVar10 = tableLog;
      do {
        uVar23 = (ulong)UVar10;
        UVar10 = UVar10 - 1;
        uVar19 = uVar19 + 1;
      } while (*(U32 *)((long)*rankStats + uVar23 * 4) == 0);
      uVar23 = (ulong)((tableLog - uVar19) + 2);
      local_114 = 0;
      for (lVar16 = 0x9d; lVar16 - 0x9cU < uVar23; lVar16 = lVar16 + 1) {
        iVar26 = *(int *)((long)local_f0 + lVar16 * 4);
        *(uint *)((long)local_f0 + lVar16 * 4 + 0x38) = local_114;
        local_114 = iVar26 + local_114;
      }
      *(uint *)(local_f0 + 0x55) = local_114;
      for (uVar20 = 0; nbSymbols != uVar20; uVar20 = uVar20 + 1) {
        bVar12 = *(byte *)((long)local_f0 + uVar20 + 0x4dc);
        uVar15 = *(uint *)((long)local_f0 + (ulong)bVar12 * 4 + 0x2a8);
        *(uint *)((long)local_f0 + (ulong)bVar12 * 4 + 0x2a8) = uVar15 + 1;
        *(char *)((long)local_f0 + (ulong)uVar15 * 2 + 0x2dc) = (char)uVar20;
        *(byte *)((long)local_f0 + (ulong)uVar15 * 2 + 0x2dd) = bVar12;
      }
      *(undefined4 *)(local_f0 + 0x55) = 0;
      iVar26 = 0;
      for (uVar20 = 1; uVar20 < uVar23; uVar20 = uVar20 + 1) {
        iVar6 = *(int *)((long)local_f0 + uVar20 * 4 + 0x270);
        bVar12 = (byte)iVar14;
        *(int *)((long)local_f0 + uVar20 * 4) = iVar26;
        iVar14 = iVar14 + 1;
        iVar26 = (iVar6 << (bVar12 & 0x1f)) + iVar26;
      }
      iVar14 = tableLog + 1;
      lVar16 = (ulong)uVar19 * 0x34;
      for (uVar15 = uVar19; uVar20 = 1, uVar15 < (uVar9 - uVar19) + 1; uVar15 = uVar15 + 1) {
        for (; uVar20 < uVar23; uVar20 = uVar20 + 1) {
          *(uint *)((long)local_f0 + uVar20 * 4 + lVar16) =
               *(uint *)((long)local_f0 + uVar20 * 4) >> ((byte)uVar15 & 0x1f);
        }
        lVar16 = lVar16 + 0x34;
      }
      uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)local_f0 + 0x1c) >> 0x20);
      uStack_44 = *(undefined8 *)((long)local_f0 + 0x24);
      uStack_3c = *(undefined8 *)((long)local_f0 + 0x2c);
      uStack_68 = *local_f0;
      uStack_60 = local_f0[1];
      uStack_58 = (undefined4)local_f0[2];
      local_54 = (undefined4)((ulong)local_f0[2] >> 0x20);
      uStack_50 = (undefined4)local_f0[3];
      uStack_4c = (undefined4)((ulong)local_f0[3] >> 0x20);
      for (uVar23 = 0; uVar23 != local_114; uVar23 = uVar23 + 1) {
        bVar12 = *(byte *)((long)local_f0 + uVar23 * 2 + 0x2dc);
        bVar2 = *(byte *)((long)local_f0 + uVar23 * 2 + 0x2dd);
        uVar24 = iVar14 - (uint)bVar2;
        uVar15 = *(uint *)((long)&uStack_68 + (ulong)bVar2 * 4);
        uVar20 = (ulong)uVar15;
        bVar13 = (byte)(uVar9 - uVar24);
        iVar26 = 1 << (bVar13 & 0x1f);
        if (uVar9 - uVar24 < uVar19) {
          for (; uVar20 < iVar26 + uVar15; uVar20 = uVar20 + 1) {
            DTable[uVar20 + 1] = (uVar24 & 0xff) * 0x10000 + (uint)bVar12 + 0x1000000;
          }
        }
        else {
          uVar21 = uVar24 + (iVar14 - uVar9);
          uVar22 = 1;
          if (1 < (int)uVar21) {
            uVar22 = (ulong)uVar21;
          }
          uVar7 = *(uint *)((long)local_f0 + uVar22 * 4 + 0x2a4);
          lVar16 = (ulong)uVar24 * 0x34;
          puVar1 = (undefined8 *)((long)local_f0 + lVar16);
          uStack_88 = (undefined4)((ulong)*(undefined8 *)((long)local_f0 + lVar16 + 0x1c) >> 0x20);
          uStack_84 = *(undefined8 *)((long)local_f0 + lVar16 + 0x24);
          uStack_7c = *(undefined8 *)((long)local_f0 + lVar16 + 0x2c);
          uStack_a8 = *puVar1;
          uStack_a0 = puVar1[1];
          uStack_98 = (undefined4)puVar1[2];
          local_94 = (undefined4)((ulong)puVar1[2] >> 0x20);
          uStack_90 = (undefined4)puVar1[3];
          uStack_8c = (undefined4)((ulong)puVar1[3] >> 0x20);
          if (1 < (int)uVar21) {
            uVar21 = *(uint *)((long)&uStack_a8 + uVar22 * 4);
            for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
              DTable[uVar20 + uVar22 + 1] = (uVar24 & 0xff) * 0x10000 + (uint)bVar12 + 0x1000000;
            }
          }
          lVar16 = (ulong)uVar7 * 2;
          for (uVar22 = 0; uVar22 != local_114 - uVar7; uVar22 = uVar22 + 1) {
            bVar3 = *(byte *)((long)local_f0 + uVar22 * 2 + lVar16 + 0x2dc);
            bVar4 = *(byte *)((long)local_f0 + uVar22 * 2 + lVar16 + 0x2dd);
            uVar21 = *(uint *)((long)&uStack_a8 + (ulong)bVar4 * 4);
            uVar17 = (1 << (bVar13 - (char)(iVar14 - (uint)bVar4) & 0x1f)) + uVar21;
            do {
              uVar18 = (ulong)uVar21;
              uVar21 = uVar21 + 1;
              DTable[uVar20 + uVar18 + 1] =
                   (uint)bVar12 +
                   (((iVar14 - (uint)bVar4) + uVar24 & 0xff) << 0x10 | (uint)bVar3 << 8) + 0x2000000
              ;
            } while (uVar21 < uVar17);
            *(uint *)((long)&uStack_a8 + (ulong)bVar4 * 4) = uVar17;
          }
        }
        *(uint *)((long)&uStack_68 + (ulong)bVar2 * 4) = iVar26 + uVar15;
      }
      *(char *)DTable = (char)uVar5;
      *(undefined1 *)((long)DTable + 1) = 1;
      *(char *)((long)DTable + 2) = (char)uVar5;
      *(char *)((long)DTable + 3) = (char)(uVar5 >> 0x18);
      sVar25 = sVar11;
    }
  }
  return sVar25;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}